

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

DeviceData * __thiscall
QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData>::value
          (DeviceData *__return_storage_ptr__,
          QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData> *this,QPaintDevice **key)

{
  undefined1 *puVar1;
  Node<QPaintDevice_*,_QGraphicsItemCache::DeviceData> *pNVar2;
  DeviceData *pDVar3;
  long lVar4;
  DeviceData *pDVar5;
  qreal *pqVar6;
  DeviceData *pDVar7;
  byte bVar8;
  
  bVar8 = 0;
  if (this->d != (Data *)0x0) {
    pNVar2 = QHashPrivate::Data<QHashPrivate::Node<QPaintDevice*,QGraphicsItemCache::DeviceData>>::
             findNode<QPaintDevice*>
                       ((Data<QHashPrivate::Node<QPaintDevice*,QGraphicsItemCache::DeviceData>> *)
                        this->d,key);
    if (pNVar2 != (Node<QPaintDevice_*,_QGraphicsItemCache::DeviceData> *)0x0) {
      pDVar3 = &pNVar2->value;
      goto LAB_0061e651;
    }
  }
  pDVar3 = (DeviceData *)0x0;
LAB_0061e651:
  if (pDVar3 == (DeviceData *)0x0) {
    pqVar6 = (qreal *)&DAT_00702c10;
    pDVar3 = __return_storage_ptr__;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pDVar3->lastTransform).m_matrix[0][0] = *pqVar6;
      pqVar6 = pqVar6 + (ulong)bVar8 * -2 + 1;
      pDVar3 = (DeviceData *)((long)pDVar3 + (ulong)bVar8 * -0x10 + 8);
    }
    puVar1 = &(__return_storage_ptr__->lastTransform).field_0x48;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfc00;
    (__return_storage_ptr__->cacheIndent).xp = 0;
    (__return_storage_ptr__->cacheIndent).yp = 0;
    QPixmapCache::Key::Key(&__return_storage_ptr__->key);
  }
  else {
    pDVar5 = pDVar3;
    pDVar7 = __return_storage_ptr__;
    for (lVar4 = 0xb; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pDVar7->lastTransform).m_matrix[0][0] = (pDVar5->lastTransform).m_matrix[0][0];
      pDVar5 = (DeviceData *)((long)pDVar5 + (ulong)bVar8 * -0x10 + 8);
      pDVar7 = (DeviceData *)((long)pDVar7 + (ulong)bVar8 * -0x10 + 8);
    }
    QPixmapCache::Key::Key(&__return_storage_ptr__->key,&pDVar3->key);
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }